

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qssldiffiehellmanparameters.cpp
# Opt level: O1

QSslDiffieHellmanParameters __thiscall
QSslDiffieHellmanParameters::fromEncoded
          (QSslDiffieHellmanParameters *this,QByteArray *encoded,EncodingFormat encoding)

{
  Error EVar1;
  QTlsBackend *pQVar2;
  long lVar3;
  QSslDiffieHellmanParametersPrivate *pQVar4;
  
  this->d = (QSslDiffieHellmanParametersPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QSslDiffieHellmanParameters(this);
  pQVar2 = QSslSocketPrivate::tlsBackendInUse();
  if (pQVar2 == (QTlsBackend *)0x0) {
    return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
  }
  if (encoding == Pem) {
    pQVar4 = this->d;
    pQVar2 = QSslSocketPrivate::tlsBackendInUse();
    if (pQVar2 == (QTlsBackend *)0x0) {
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
    lVar3 = 0x138;
  }
  else {
    if (encoding != Der) {
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
    pQVar4 = this->d;
    pQVar2 = QSslSocketPrivate::tlsBackendInUse();
    if (pQVar2 == (QTlsBackend *)0x0) {
      return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
    }
    lVar3 = 0x130;
  }
  EVar1 = (**(code **)(*(long *)pQVar2 + lVar3))(pQVar2,encoded,&pQVar4->derData);
  pQVar4->error = EVar1;
  return (QSslDiffieHellmanParameters)(QSslDiffieHellmanParametersPrivate *)this;
}

Assistant:

QSslDiffieHellmanParameters QSslDiffieHellmanParameters::fromEncoded(const QByteArray &encoded, QSsl::EncodingFormat encoding)
{
    QSslDiffieHellmanParameters result;
    const auto *tlsBackend = QSslSocketPrivate::tlsBackendInUse();
    if (!tlsBackend)
        return result;
    switch (encoding) {
    case QSsl::Der:
        result.d->initFromDer(encoded);
        break;
    case QSsl::Pem:
        result.d->initFromPem(encoded);
        break;
    }
    return result;
}